

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcPolyLoop::IfcPolyLoop(IfcPolyLoop *this)

{
  *(undefined ***)&this->field_0x58 = &PTR__Object_0073a1d0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(char **)&this->field_0x68 = "IfcPolyLoop";
  IfcLoop::IfcLoop(&this->super_IfcLoop,&PTR_construction_vtable_24__007b4ff0);
  *(undefined8 *)&(this->super_IfcLoop).field_0x38 = 0;
  (this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x7b4f38;
  *(undefined8 *)&this->field_0x58 = 0x7b4fd8;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x7b4f60;
  *(undefined8 *)
   &(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x7b4f88;
  *(undefined8 *)&(this->super_IfcLoop).super_IfcTopologicalRepresentationItem.field_0x30 = 0x7b4fb0
  ;
  *(undefined8 *)&(this->super_IfcLoop).field_0x40 = 0;
  *(undefined8 *)&this->field_0x48 = 0;
  *(undefined8 *)&this->field_0x50 = 0;
  return;
}

Assistant:

IfcPolyLoop() : Object("IfcPolyLoop") {}